

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# linux.c
# Opt level: O0

int uv__get_cgroupv2_constrained_cpu(char *cgroup,uv__cpu_constraint *constraint)

{
  int iVar1;
  size_t sVar2;
  char local_548 [8];
  char quota_buf [16];
  char *cgroup_trimmed;
  int cgroup_size;
  uint weight;
  char buf [1024];
  char path [256];
  uv__cpu_constraint *constraint_local;
  char *cgroup_local;
  
  iVar1 = strncmp(cgroup,"0::/",4);
  if (iVar1 == 0) {
    quota_buf._8_8_ = cgroup + 4;
    sVar2 = strcspn((char *)quota_buf._8_8_,"\n");
    cgroup_trimmed._0_4_ = (uint)sVar2;
    snprintf(buf + 0x3f8,0x100,"/sys/fs/cgroup/%.*s/cpu.max",sVar2 & 0xffffffff,quota_buf._8_8_);
    iVar1 = uv__slurp(buf + 0x3f8,(char *)&cgroup_size,0x400);
    if (iVar1 < 0) {
      cgroup_local._4_4_ = -5;
    }
    else {
      iVar1 = sscanf((char *)&cgroup_size,"%15s %llu",local_548,&constraint->period_length);
      if (iVar1 == 2) {
        iVar1 = strncmp(local_548,"max",3);
        if (iVar1 == 0) {
          constraint->quota_per_period = 0x7fffffffffffffff;
        }
        else {
          iVar1 = sscanf(local_548,"%lld",constraint);
          if (iVar1 != 1) {
            return -0x16;
          }
        }
        snprintf(buf + 0x3f8,0x100,"/sys/fs/cgroup/%.*s/cpu.weight",(ulong)(uint)cgroup_trimmed,
                 quota_buf._8_8_);
        iVar1 = uv__slurp(buf + 0x3f8,(char *)&cgroup_size,0x400);
        if (iVar1 < 0) {
          cgroup_local._4_4_ = -5;
        }
        else {
          iVar1 = sscanf((char *)&cgroup_size,"%u",(long)&cgroup_trimmed + 4);
          if (iVar1 == 1) {
            constraint->proportions = (double)cgroup_trimmed._4_4_ / 100.0;
            cgroup_local._4_4_ = 0;
          }
          else {
            cgroup_local._4_4_ = -0x16;
          }
        }
      }
      else {
        cgroup_local._4_4_ = -0x16;
      }
    }
  }
  else {
    cgroup_local._4_4_ = -0x16;
  }
  return cgroup_local._4_4_;
}

Assistant:

static int uv__get_cgroupv2_constrained_cpu(const char* cgroup, 
                                            uv__cpu_constraint* constraint) {
  char path[256];
  char buf[1024];
  unsigned int weight;
  int cgroup_size;
  const char* cgroup_trimmed;
  char quota_buf[16];

  if (strncmp(cgroup, "0::/", 4) != 0)
    return UV_EINVAL;
   
  /* Trim ending \n by replacing it with a 0 */
  cgroup_trimmed = cgroup + sizeof("0::/") - 1;      /* Skip the prefix "0::/" */
  cgroup_size = (int)strcspn(cgroup_trimmed, "\n");  /* Find the first slash */

  /* Construct the path to the cpu.max file */
  snprintf(path, sizeof(path), "/sys/fs/cgroup/%.*s/cpu.max", cgroup_size,
           cgroup_trimmed);

  /* Read cpu.max */
  if (uv__slurp(path, buf, sizeof(buf)) < 0)
    return UV_EIO;

  if (sscanf(buf, "%15s %llu", quota_buf, &constraint->period_length) != 2)
    return UV_EINVAL;

  if (strncmp(quota_buf, "max", 3) == 0)
    constraint->quota_per_period = LLONG_MAX;
  else if (sscanf(quota_buf, "%lld", &constraint->quota_per_period) != 1)
    return UV_EINVAL; // conversion failed

  /* Construct the path to the cpu.weight file */
  snprintf(path, sizeof(path), "/sys/fs/cgroup/%.*s/cpu.weight", cgroup_size,
           cgroup_trimmed);

  /* Read cpu.weight */
  if (uv__slurp(path, buf, sizeof(buf)) < 0)
    return UV_EIO;

  if (sscanf(buf, "%u", &weight) != 1)
    return UV_EINVAL;

  constraint->proportions = (double)weight / 100.0;

  return 0;
}